

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-formatter-test.cc
# Opt level: O1

void __thiscall CustomFormatterTest_Format_Test::TestBody(CustomFormatterTest_Format_Test *this)

{
  bool bVar1;
  char *message;
  string_view format_str;
  format_args args;
  AssertionResult gtest_ar;
  AssertHelper local_48 [2];
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28;
  
  local_48[0].data_ = (AssertHelperData *)0xbee4f8b588e368f1;
  format_str.size_ = 6;
  format_str.data_ = "{:.2f}";
  args.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_48;
  args.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = fmt::v5::
            format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
            ::TYPES;
  custom_vformat_abi_cxx11_(&local_28,format_str,args);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_38,"\"0.00\"","custom_format(\"{:.2f}\", -.00001)",(char (*) [5])"0.00",&local_28
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/custom-formatter-test.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_28._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
      }
      local_28._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(CustomFormatterTest, Format) {
  EXPECT_EQ("0.00", custom_format("{:.2f}", -.00001));
}